

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guild.cpp
# Opt level: O2

void Handlers::Guild_Buy(Character *character,PacketReader *reader)

{
  World *pWVar1;
  uint amount;
  int iVar2;
  mapped_type *pmVar3;
  uint uVar4;
  allocator<char> local_49;
  PacketBuilder reply;
  
  if ((character->trading == false) && ((character->nointeract & 2) == 0)) {
    PacketReader::GetInt(reader);
    amount = PacketReader::GetInt(reader);
    if ((-1 < (int)amount) &&
       ((character->npc_type == Guild &&
        ((character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0)))) {
      pWVar1 = character->world;
      std::__cxx11::string::string<std::allocator<char>>((string *)&reply,"GuildBankMax",&local_49);
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&reply);
      iVar2 = util::variant::GetInt(pmVar3);
      uVar4 = iVar2 - ((character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->bank;
      std::__cxx11::string::~string((string *)&reply);
      if (0 < (int)uVar4) {
        if (uVar4 < amount) {
          amount = uVar4;
        }
        pWVar1 = character->world;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&reply,"GuildMinDeposit",&local_49);
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar1->config,(key_type *)&reply);
        iVar2 = util::variant::GetInt(pmVar3);
        if ((int)amount < iVar2) {
          std::__cxx11::string::~string((string *)&reply);
        }
        else {
          iVar2 = Character::HasItem(character,1,false);
          std::__cxx11::string::~string((string *)&reply);
          if ((int)amount <= iVar2) {
            Character::DelItem(character,1,amount);
            Guild::AddBank((character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,amount);
            PacketBuilder::PacketBuilder(&reply,PACKET_GUILD,PACKET_BUY,4);
            iVar2 = Character::HasItem(character,1,false);
            PacketBuilder::AddInt(&reply,iVar2);
            Character::Send(character,&reply);
            PacketBuilder::~PacketBuilder(&reply);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Guild_Buy(Character *character, PacketReader &reader)
{
	if (character->trading) return;
	if (!character->CanInteractItems()) return;

	/*int session = */reader.GetInt();
	int gold = reader.GetInt();

	if (gold < 0)
		return;

	if (character->npc_type == ENF::Guild)
	{
		if (character->guild)
		{
			int max_deposit = int(character->world->config["GuildBankMax"]) - character->guild->bank;

			if (max_deposit <= 0)
				return;

			gold = std::min(gold, max_deposit);

			if (gold >= static_cast<int>(character->world->config["GuildMinDeposit"]) && character->HasItem(1) >= gold)
			{
				character->DelItem(1, gold);
				character->guild->AddBank(gold);

				PacketBuilder reply(PACKET_GUILD, PACKET_BUY, 4);
				reply.AddInt(character->HasItem(1));
				character->Send(reply);
			}
		}
	}
}